

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_stg1.c
# Opt level: O0

int cvNlsLSolveSensStg1(N_Vector delta,void *cvode_mem)

{
  int iVar1;
  long in_RSI;
  undefined8 in_RDI;
  int is;
  int retval;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RSI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0xf3,"cvNlsLSolveSensStg1",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg1.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    iVar1 = (**(code **)(in_RSI + 2000))
                      (in_RSI,in_RDI,
                       *(undefined8 *)
                        (*(long *)(in_RSI + 0x2f0) + (long)*(int *)(in_RSI + 0x764) * 8),
                       *(undefined8 *)(in_RSI + 0x1c0),*(undefined8 *)(in_RSI + 0x1d8));
    if (iVar1 < 0) {
      local_4 = -7;
    }
    else if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      local_4 = 0x386;
    }
  }
  return local_4;
}

Assistant:

static int cvNlsLSolveSensStg1(N_Vector delta, void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval, is;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* get index of current sensitivity solve */
  is = cv_mem->sens_solve_idx;

  /* solve the sensitivity linear systems */
  retval = cv_mem->cv_lsolve(cv_mem, delta, cv_mem->cv_ewtS[is], cv_mem->cv_y,
                             cv_mem->cv_ftemp);

  if (retval < 0) { return (CV_LSOLVE_FAIL); }
  if (retval > 0) { return (SUN_NLS_CONV_RECVR); }

  return (CV_SUCCESS);
}